

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall QWidgetTextControlPrivate::gotoPreviousTableCell(QWidgetTextControlPrivate *this)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined1 *local_58;
  undefined4 local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QTextCursor::currentTable();
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextTable::cellAt((QTextCursor *)&local_48);
  iVar3 = QTextTableCell::column();
  iVar4 = QTextTableCell::row();
  if ((0 < iVar3) || (QTextTable::columns(), 0 < iVar4)) {
    QTextTable::cellAt((int)&local_58,iVar2);
    local_48 = local_58;
    puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,local_50);
    QTextTableCell::firstCursorPosition();
    puVar1 = *(undefined1 **)&this->cursor;
    *(undefined1 **)&this->cursor = local_58;
    local_58 = puVar1;
    QTextCursor::~QTextCursor((QTextCursor *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::gotoPreviousTableCell()
{
    QTextTable *table = cursor.currentTable();
    QTextTableCell cell = table->cellAt(cursor);

    int newColumn = cell.column() - 1;
    int newRow = cell.row();

    if (newColumn < 0) {
        newColumn = table->columns() - 1;
        --newRow;
        if (newRow < 0)
            return;
    }

    cell = table->cellAt(newRow, newColumn);
    cursor = cell.firstCursorPosition();
}